

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSemi.c
# Opt level: O3

int Ssw_SemCheckTargets(Ssw_Sem_t *p)

{
  Aig_Man_t *pAVar1;
  Aig_Obj_t **ppAVar2;
  long lVar3;
  long lVar4;
  Aig_Obj_t *pAVar5;
  
  lVar3 = (long)p->vTargets->nSize;
  if (0 < lVar3) {
    pAVar1 = p->pMan->pAig;
    ppAVar2 = pAVar1->pReprs;
    lVar4 = 0;
    do {
      if (ppAVar2 == (Aig_Obj_t **)0x0) {
        pAVar5 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar5 = ppAVar2[*(int *)((long)p->vTargets->pArray[lVar4] + 0x24)];
      }
      if (pAVar5 != pAVar1->pConst1) {
        return 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  return 0;
}

Assistant:

int Ssw_SemCheckTargets( Ssw_Sem_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vTargets, pObj, i )
        if ( !Ssw_ObjIsConst1Cand(p->pMan->pAig, pObj) )
            return 1;
    return 0;
}